

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ram_test.cc
# Opt level: O0

int test_list_entities_for_policy(void)

{
  code *pcVar1;
  char *__s;
  RamListEntitiesForPolicyRequestType *pRVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_171;
  int ret;
  HttpTestListener *local_150;
  HttpTestListener *listener;
  string local_140;
  allocator<char> local_119;
  string local_118 [39];
  allocator<char> local_f1;
  string local_f0 [55];
  allocator<char> local_b9;
  string local_b8 [32];
  RamListEntitiesForPolicyRequestType *local_98;
  Ram *ram;
  RamListEntitiesForPolicyResponseType resp;
  RamListEntitiesForPolicyRequestType req;
  
  aliyun::RamListEntitiesForPolicyRequestType::RamListEntitiesForPolicyRequestType
            ((RamListEntitiesForPolicyRequestType *)
             &resp.roles.
              super__Vector_base<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  aliyun::RamListEntitiesForPolicyResponseType::RamListEntitiesForPolicyResponseType
            ((RamListEntitiesForPolicyResponseType *)&ram);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"cn-hangzhou",&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"my_appid",&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_118,"my_secret",&local_119);
  pRVar2 = (RamListEntitiesForPolicyRequestType *)
           aliyun::Ram::CreateRamClient(local_b8,local_f0,local_118);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  local_98 = pRVar2;
  if (pRVar2 == (RamListEntitiesForPolicyRequestType *)0x0) {
    aliyun::RamListEntitiesForPolicyResponseType::~RamListEntitiesForPolicyResponseType
              ((RamListEntitiesForPolicyResponseType *)&ram);
    aliyun::RamListEntitiesForPolicyRequestType::~RamListEntitiesForPolicyRequestType
              ((RamListEntitiesForPolicyRequestType *)
               &resp.roles.
                super__Vector_base<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Ram::SetProxyHost((Ram *)pRVar2,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Ram::SetUseTls((Ram *)local_98,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_list_entities_for_policy_response;
  local_150 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_171);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_171);
  HttpTestListener::Start(local_150);
  std::__cxx11::string::operator=
            ((string *)
             &resp.roles.
              super__Vector_base<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"PolicyType");
  std::__cxx11::string::operator=((string *)(req.policy_type.field_2._M_local_buf + 8),"PolicyName")
  ;
  aliyun::Ram::ListEntitiesForPolicy
            (local_98,(RamListEntitiesForPolicyResponseType *)
                      &resp.roles.
                       super__Vector_base<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(RamErrorInfo *)&ram);
  HttpTestListener::WaitComplete(local_150);
  pHVar3 = local_150;
  if (local_150 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_150);
    operator_delete(pHVar3,0x180);
  }
  pRVar2 = local_98;
  if (local_98 != (RamListEntitiesForPolicyRequestType *)0x0) {
    aliyun::Ram::~Ram((Ram *)local_98);
    operator_delete(pRVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_list_entities_for_policy() {
  RamListEntitiesForPolicyRequestType req;
  RamListEntitiesForPolicyResponseType resp;
  Ram* ram = Ram::CreateRamClient("cn-hangzhou", "my_appid", "my_secret");
  if(!ram) return 0;
  ram->SetProxyHost("127.0.0.1:12234");
  ram->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_list_entities_for_policy_response);
  listener->Start();
  req.policy_type = "PolicyType";
  req.policy_name = "PolicyName";
  int ret = ram->ListEntitiesForPolicy(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete ram;
}